

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void mcbsp_get(mcbsp_pid_t pid,void *src,mcbsp_size_t offset,void *dst,mcbsp_size_t size)

{
  pointer pMVar1;
  ulong uVar2;
  void *pvVar3;
  Memslot src_slot;
  long lVar4;
  long lVar5;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_get: can only be called within SPMD section\n");
  }
  if (size == 0) {
    return;
  }
  if ((uint)s_spmd->m_nprocs < pid) {
    bsp_abort("bsp_get: The source process ID does not exist\n");
  }
  if (src != (void *)0x0) {
    src_slot = lookup_usable_reg(src,"bsp_get");
    lVar4 = (long)s_rdma->m_nprocs * src_slot;
    pMVar1 = (s_rdma->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = pMVar1[lVar4 + (int)pid].size;
    lVar5 = (size + offset) - uVar2;
    if (uVar2 <= size + offset && lVar5 != 0) {
      pvVar3 = pMVar1[lVar4 + (int)pid].addr;
      bsp_abort("bsp_get: Reads %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",lVar5
                ,pvVar3,pvVar3,uVar2,pid);
    }
    bsplib::Rdma::get(s_rdma,pid,src_slot,offset,dst,size);
    return;
  }
  bsp_abort("bsp_get: Source address cannot be identified by NULL\n");
  __assert_fail("addr != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                ,0x168,"bsplib::Rdma::Memslot lookup_usable_reg(const void *, const char *)");
}

Assistant:

void mcbsp_get( mcbsp_pid_t pid, const void * src,
    mcbsp_size_t offset, const void * dst, mcbsp_size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::GET, size );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_get: can only be called within SPMD section\n");

    if (size == 0) // ignore any empty reads
        return;

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_get: The source process ID does not exist\n");

    if ( src == NULL )
        bsp_abort("bsp_get: Source address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot src_slot_id = lookup_usable_reg( src, "bsp_get" );
    bsplib::Rdma::Memblock src_slot = s_rdma->slot( pid, src_slot_id );

    if ( size_t(offset + size ) > src_slot.size )
        bsp_abort("bsp_get: Reads %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + size - src_slot.size,
                  src_slot.addr, src_slot.addr, src_slot.size, pid );

    s_rdma->get( pid, src_slot_id , offset, const_cast<void*>(dst), size );
}